

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrSystemProperties *value
                         )

{
  pointer *this;
  size_t sVar1;
  allocator local_319;
  string local_318 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2f8;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_290;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  allocator local_209;
  string local_208 [32];
  undefined1 local_1e8 [40];
  string local_1c0 [8];
  string error_message;
  allocator local_199;
  string local_198 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_178;
  allocator local_159;
  string local_158 [36];
  NextChainResult local_134;
  value_type local_130;
  NextChainResult next_result;
  value_type local_128 [39];
  value_type local_8c;
  undefined1 local_88 [8];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrSystemProperties *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSystemProperties",value->type,
               "VUID-XrSystemProperties-type-type",XR_TYPE_SYSTEM_PROPERTIES,
               "XR_TYPE_SYSTEM_PROPERTIES");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = XR_TYPE_SYSTEM_ANCHOR_PROPERTIES_HTC;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,&local_8c);
    local_128[0x22] = 0x3ba0a9ec;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x22);
    local_128[0x21] = 0x3b9bf2e4;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x21);
    local_128[0x20] = 0x3b9fac00;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x20);
    local_128[0x1f] = 0x3ba38096;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1f);
    local_128[0x1e] = 0x3b9c6fe0;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1e);
    local_128[0x1d] = 0x3b9f3abf;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1d);
    local_128[0x1c] = 0x3b9b3f30;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1c);
    local_128[0x1b] = 0x3b9ddf14;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1b);
    local_128[0x1a] = 0x3b9f2b25;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x1a);
    local_128[0x19] = 0x3b9ddb2c;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x19);
    local_128[0x18] = 0x3ba224d4;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x18);
    local_128[0x17] = 0x3b9c6040;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x17);
    local_128[0x16] = 0x3ba082d8;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x16);
    local_128[0x15] = 0x3b9ca2aa;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x15);
    local_128[0x14] = 0x3b9dd742;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x14);
    local_128[0x13] = 0x3b9b9520;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x13);
    local_128[0x12] = 0x3b9b9138;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x12);
    local_128[0x11] = 0x3b9e8708;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x11);
    local_128[0x10] = 0x3b9c8f22;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0x10);
    local_128[0xf] = 0x3b9cae60;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0xf);
    local_128[0xe] = 0x3b9ce510;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0xe);
    local_128[0xd] = 0x3b9ed910;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0xd);
    local_128[0xc] = 0x3b9c96f6;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0xc);
    local_128[0xb] = 0x3b9c96f0;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 0xb);
    local_128[10] = 0x3ba155cf;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 10);
    local_128[9] = 0x3b9c9adc;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 9);
    local_128[8] = 0x3b9d65f9;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 8);
    local_128[7] = 0x3ba0bd70;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 7);
    local_128[6] = 0x3ba0c158;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 6);
    local_128[5] = 0x3ba384c4;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 5);
    local_128[4] = 0x3b9c836c;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 4);
    local_128[3] = 0x3b9f36d0;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 3);
    local_128[2] = 0x3ba0c928;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 2);
    local_128[1] = 0x3ba0c540;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128 + 1);
    local_128[0] = XR_TYPE_SYSTEM_SPATIAL_SENSING_PROPERTIES_BD;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_128);
    next_result = 0x3ba1f5f1;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&next_result);
    local_130 = XR_TYPE_SYSTEM_VIRTUAL_KEYBOARD_PROPERTIES_META;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_130);
    local_134 = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                  (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                  &duplicate_ext_structs.
                                   super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                  local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                            *)&encountered_structs.
                                               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_134 == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"VUID-XrSystemProperties-next-next",&local_159);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_178,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_198,
                 "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"",
                 &local_199);
      CoreValidLogMessage(instance_info,(string *)local_158,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_178,(string *)local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_178);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_134 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c0,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_1e8 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_1e8 + 0x27));
      std::__cxx11::string::operator+=(local_1c0,"XrSystemProperties : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_1e8,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_1c0,(string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"VUID-XrSystemProperties-next-unique",&local_209);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_248,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct"
                 ,&local_249);
      CoreValidLogMessage(instance_info,(string *)local_208,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_228,(string *)local_248);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_228);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_1c0);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    sVar1 = strlen(value->systemName);
    if (sVar1 < 0x101) {
      instance_info_local._4_4_ =
           ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                            &value->trackingProperties);
      if (instance_info_local._4_4_ != XR_SUCCESS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2d8,"VUID-XrSystemProperties-trackingProperties-parameter",&local_2d9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_2f8,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_318,"Structure XrSystemProperties member trackingProperties is invalid",
                   &local_319);
        CoreValidLogMessage(instance_info,(string *)local_2d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_2f8,(string *)local_318);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_2f8);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_270,"VUID-XrSystemProperties-systemName-parameter",&local_271);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_290,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b0,"Structure XrSystemProperties member systemName length is too long.",
                 &local_2b1);
      CoreValidLogMessage(instance_info,(string *)local_270,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_290,(string *)local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_290);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSystemProperties* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSystemProperties",
                             value->type, "VUID-XrSystemProperties-type-type", XR_TYPE_SYSTEM_PROPERTIES, "XR_TYPE_SYSTEM_PROPERTIES");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ANCHOR_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOCATION_DISCOVERY_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOR_SPACE_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ENVIRONMENT_DEPTH_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_GAZE_INTERACTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_EXPRESSION_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FORCE_FEEDBACK_CURL_PROPERTIES_MNDX);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATED_RENDERING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATION_EYE_TRACKED_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_MESH_PROPERTIES_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HEADSET_ID_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_KEYBOARD_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_TRACKING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_UNDERSTANDING_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_COLOR_LUT_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PLANE_DETECTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_RENDER_MODEL_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPACE_WARP_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_SHARING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_GROUP_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_MESH_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SCENE_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SENSING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_USER_PRESENCE_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_VIRTUAL_KEYBOARD_PROPERTIES_META);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSystemProperties : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_SYSTEM_NAME_SIZE < std::strlen(value->systemName)) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-systemName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member systemName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrSystemTrackingProperties is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->trackingProperties);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-trackingProperties-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member trackingProperties is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}